

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O1

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>>
          (any_executor_base *this,
          binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
          *f)

{
  _func_void_any_executor_base_ptr_function_view *UNRECOVERED_JUMPTABLE;
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  non_const_lvalue<asio::detail::binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>_>
  f2;
  function_view fVar2;
  allocator<void> local_51;
  executor_function local_50;
  binder1<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_std::error_code>
  local_48;
  
  UNRECOVERED_JUMPTABLE = this->target_fns_->blocking_execute;
  if (UNRECOVERED_JUMPTABLE != (_func_void_any_executor_base_ptr_function_view *)0x0) {
    fVar2.function_ = f;
    fVar2.complete_ =
         asio::detail::executor_function_view::
         complete<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>>
    ;
    (*UNRECOVERED_JUMPTABLE)(this,fVar2);
    return;
  }
  p_Var1 = this->target_fns_->execute;
  local_48.handler_._M_f = (f->handler_)._M_f;
  local_48.handler_._8_8_ = *(undefined8 *)&(f->handler_).field_0x8;
  local_48.handler_._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_nuraft::asio_service_impl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>)
       (f->handler_)._M_bound_args.
       super__Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>.
       super__Head_base<0UL,_nuraft::asio_service_impl_*,_false>._M_head_impl;
  local_48.arg1_._M_value = (f->arg1_)._M_value;
  local_48.arg1_._4_4_ = *(undefined4 *)&(f->arg1_).field_0x4;
  local_48.arg1_._M_cat = (f->arg1_)._M_cat;
  asio::detail::executor_function::
  executor_function<asio::detail::binder1<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,std::error_code>,std::allocator<void>>
            (&local_50,&local_48,&local_51);
  (*p_Var1)(this,&local_50);
  if (local_50.impl_ != (impl_base *)0x0) {
    (*(local_50.impl_)->complete_)(local_50.impl_,false);
  }
  return;
}

Assistant:

void execute(ASIO_MOVE_ARG(F) f) const
  {
    if (target_fns_->blocking_execute != 0)
    {
      asio::detail::non_const_lvalue<F> f2(f);
      target_fns_->blocking_execute(*this, function_view(f2.value));
    }
    else
    {
      target_fns_->execute(*this,
          function(ASIO_MOVE_CAST(F)(f), std::allocator<void>()));
    }
  }